

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O3

int luaopen_package(lua_State *L)

{
  int n;
  long lVar1;
  
  luaL_getsubtable(L,-0xf4628,"_CLIBS");
  lVar1 = 0;
  n = 1;
  lua_createtable(L,0,1);
  lua_pushcclosure(L,gctm,0);
  lua_setfield(L,-2,"__gc");
  lua_setmetatable(L,-2);
  lua_createtable(L,0,2);
  luaL_setfuncs(L,pk_funcs,0);
  lua_createtable(L,4,0);
  do {
    lua_pushvalue(L,-2);
    lua_pushcclosure(L,*(lua_CFunction *)((long)&createsearcherstable_searchers + lVar1),1);
    lua_rawseti(L,-2,n);
    lVar1 = lVar1 + 8;
    n = n + 1;
  } while (lVar1 != 0x20);
  lua_setfield(L,-2,"searchers");
  setpath(L,"path","LUA_PATH_5_2","LUA_PATH",
          "/usr/local/share/lua/5.2/?.lua;/usr/local/share/lua/5.2/?/init.lua;/usr/local/lib/lua/5.2/?.lua;/usr/local/lib/lua/5.2/?/init.lua;./?.lua"
         );
  setpath(L,"cpath","LUA_CPATH_5_2","LUA_CPATH",
          "/usr/local/lib/lua/5.2/?.so;/usr/local/lib/lua/5.2/loadall.so;./?.so");
  lua_pushlstring(L,"/\n;\n?\n!\n-\n",10);
  lua_setfield(L,-2,"config");
  luaL_getsubtable(L,-0xf4628,"_LOADED");
  lua_setfield(L,-2,"loaded");
  luaL_getsubtable(L,-0xf4628,"_PRELOAD");
  lua_setfield(L,-2,"preload");
  lua_rawgeti(L,-0xf4628,2);
  lua_pushvalue(L,-2);
  luaL_setfuncs(L,ll_funcs,1);
  lua_settop(L,-2);
  return 1;
}

Assistant:

LUAMOD_API int luaopen_package (lua_State *L) {
  /* create table CLIBS to keep track of loaded C libraries */
  luaL_getsubtable(L, LUA_REGISTRYINDEX, CLIBS);
  lua_createtable(L, 0, 1);  /* metatable for CLIBS */
  lua_pushcfunction(L, gctm);
  lua_setfield(L, -2, "__gc");  /* set finalizer for CLIBS table */
  lua_setmetatable(L, -2);
  /* create `package' table */
  luaL_newlib(L, pk_funcs);
  createsearcherstable(L);
#if defined(LUA_COMPAT_LOADERS)
  lua_pushvalue(L, -1);  /* make a copy of 'searchers' table */
  lua_setfield(L, -3, "loaders");  /* put it in field `loaders' */
#endif
  lua_setfield(L, -2, "searchers");  /* put it in field 'searchers' */
  /* set field 'path' */
  setpath(L, "path", LUA_PATHVERSION, LUA_PATH, LUA_PATH_DEFAULT);
  /* set field 'cpath' */
  setpath(L, "cpath", LUA_CPATHVERSION, LUA_CPATH, LUA_CPATH_DEFAULT);
  /* store config information */
  lua_pushliteral(L, LUA_DIRSEP "\n" LUA_PATH_SEP "\n" LUA_PATH_MARK "\n"
                     LUA_EXEC_DIR "\n" LUA_IGMARK "\n");
  lua_setfield(L, -2, "config");
  /* set field `loaded' */
  luaL_getsubtable(L, LUA_REGISTRYINDEX, "_LOADED");
  lua_setfield(L, -2, "loaded");
  /* set field `preload' */
  luaL_getsubtable(L, LUA_REGISTRYINDEX, "_PRELOAD");
  lua_setfield(L, -2, "preload");
  lua_pushglobaltable(L);
  lua_pushvalue(L, -2);  /* set 'package' as upvalue for next lib */
  luaL_setfuncs(L, ll_funcs, 1);  /* open lib into global table */
  lua_pop(L, 1);  /* pop global table */
  return 1;  /* return 'package' table */
}